

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::FFlux
          (MLEBABecLap *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location flux_loc,int face_only)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  pointer pFVar8;
  Geometry *this_00;
  const_reference ppFVar9;
  long *in_RDI;
  long in_R8;
  int in_R9D;
  undefined4 in_stack_00000008;
  Box tzbx_1;
  iterator __end5_5;
  iterator __begin5_5;
  range_impl<amrex::Box> *__range5_5;
  Box tybx_1;
  iterator __end5_4;
  iterator __begin5_4;
  range_impl<amrex::Box> *__range5_4;
  Box txbx_1;
  iterator __end5_3;
  iterator __begin5_3;
  range_impl<amrex::Box> *__range5_3;
  Real dhz_1;
  Real dhy_1;
  Real dhx_1;
  Array4<const_double> *bzcoef_1;
  Array4<const_double> *bycoef_1;
  Array4<const_double> *bxcoef_1;
  Array4<const_double> *phi_1;
  Array4<const_double> *apz_1;
  Array4<const_double> *apy_1;
  Array4<const_double> *apx_1;
  Array<const_MultiCutFab_*,_3> *area_1;
  Box tzbx;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  Box tybx;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  Box txbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  bool phi_on_centroid;
  bool beta_on_centroid;
  Real dhz;
  Real dhy;
  Real dhx;
  Array4<const_int> *msk;
  Array4<const_double> *bzcoef;
  Array4<const_double> *bycoef;
  Array4<const_double> *bxcoef;
  Array4<const_double> *phi;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Array<const_MultiCutFab_*,_3> *fcent;
  Array<const_MultiCutFab_*,_3> *area;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType fabtyp;
  Array4<double> *fz;
  Array4<double> *fy;
  Array4<double> *fx;
  Box bx_3;
  Box *zbx;
  Box bx_2;
  Box *ybx;
  Box bx_1;
  Box *xbx;
  iMultiFab *ccmask;
  FArrayBox *bz;
  FArrayBox *by;
  FArrayBox *bx;
  Real *dxinv;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int ncomp;
  Box *box;
  int mglev;
  int compute_flux_at_centroid;
  int hif;
  int lof;
  int hif_1;
  int lof_1;
  int hif_2;
  int lof_2;
  int hif_3;
  int lof_3;
  int hif_4;
  int lof_4;
  int hif_5;
  int lof_5;
  undefined4 in_stack_ffffffffffffda98;
  undefined4 in_stack_ffffffffffffda9c;
  MultiCutFab *in_stack_ffffffffffffdaa0;
  FabArray<amrex::IArrayBox> *in_stack_ffffffffffffdaa8;
  undefined4 in_stack_ffffffffffffdab0;
  undefined4 in_stack_ffffffffffffdab4;
  anon_class_416_12_0bbc6dcc *in_stack_ffffffffffffdae8;
  anon_class_280_8_76b9537a *f;
  undefined8 in_stack_ffffffffffffdaf0;
  undefined1 *puVar10;
  Box *in_stack_ffffffffffffdaf8;
  Array4<const_double> *this_01;
  MFIter *in_stack_ffffffffffffdb00;
  Array4<const_double> *this_02;
  FabType local_244c;
  Array4<double> *this_03;
  EBCellFlagFab *this_04;
  FabArray<amrex::EBCellFlagFab> *local_2420;
  long local_2418;
  Box local_23fc;
  iterator local_23e0;
  iterator local_23c8;
  undefined1 local_23b0 [40];
  undefined1 *local_2388;
  Box local_237c;
  iterator local_2360;
  iterator local_2348;
  undefined1 local_2330 [40];
  undefined1 *local_2308;
  Box local_22fc;
  iterator local_22e0;
  iterator local_22c8;
  undefined1 local_22b0 [40];
  undefined1 *local_2288;
  double local_2280;
  double local_2278;
  double local_2270;
  Array4<const_double> local_2268;
  Array4<const_double> *local_2228;
  Array4<const_double> local_2220;
  Array4<const_double> *local_21e0;
  Array4<const_double> local_21d8;
  Array4<const_double> *local_2198;
  Array4<const_double> local_2190;
  Array4<const_double> *local_2150;
  undefined1 local_2148 [64];
  undefined1 *local_2108;
  undefined1 local_2100 [72];
  undefined1 local_20b8 [64];
  undefined1 *local_2078;
  undefined1 local_2070 [24];
  undefined1 *local_2058;
  Box local_204c;
  iterator local_2030;
  iterator local_2018;
  undefined1 local_2000 [40];
  undefined1 *local_1fd8;
  Box local_1fcc;
  iterator local_1fb0;
  iterator local_1f98 [2];
  int in_stack_ffffffffffffe0a4;
  FArrayBox *in_stack_ffffffffffffe0a8;
  Array<FArrayBox_*,_3> *in_stack_ffffffffffffe0b0;
  Array<const_FArrayBox_*,_3> *in_stack_ffffffffffffe0b8;
  Real in_stack_ffffffffffffe0c0;
  Real *in_stack_ffffffffffffe0c8;
  Box *in_stack_ffffffffffffe0d0;
  iterator local_1f18;
  undefined1 local_1f00 [40];
  undefined1 *local_1ed8;
  byte local_1eca;
  byte local_1ec9;
  double local_1ec8;
  double local_1ec0;
  double local_1eb8;
  undefined1 local_1eb0 [64];
  undefined1 *local_1e70;
  Array4<const_double> local_1e68;
  Array4<const_double> *local_1e28;
  Array4<const_double> local_1e20;
  Array4<const_double> *local_1de0;
  Array4<const_double> local_1dd8;
  Array4<const_double> *local_1d98;
  Array4<const_double> local_1d90;
  Array4<const_double> *local_1d50;
  undefined1 local_1d48 [64];
  undefined1 *local_1d08;
  undefined1 local_1d00 [64];
  undefined1 *local_1cc0;
  undefined1 local_1cb8 [64];
  undefined1 *local_1c78;
  undefined1 local_1c70 [64];
  undefined1 *local_1c30;
  undefined1 local_1c28 [64];
  undefined1 *local_1be8;
  undefined1 local_1be0 [64];
  undefined1 *local_1ba0;
  undefined1 local_1b98 [24];
  undefined1 *local_1b80;
  undefined1 local_1b78 [24];
  undefined1 *local_1b60;
  FArrayBox *local_1b58;
  FArrayBox *local_1b50;
  FArrayBox *local_1b48;
  int local_1b40;
  int local_1b3c;
  int local_1b38;
  int local_1b34;
  int local_1af0;
  int local_1aec;
  int local_1ae8;
  int local_1ae4;
  int local_1aa0;
  int local_1a9c;
  int local_1a98;
  int local_1a94;
  FabType local_1a54;
  Array4<double> local_1a50;
  Array4<double> *local_1a10;
  Array4<double> local_1a08;
  Array4<double> *local_19c8;
  Array4<double> local_19c0;
  Array4<double> *local_1980;
  undefined1 local_1974 [40];
  Box local_194c;
  Box *local_1930;
  undefined1 local_1924 [28];
  Box *local_1908;
  iMultiFab *local_1900;
  FArrayBox *local_18f8;
  FArrayBox *local_18f0;
  FArrayBox *local_18e8;
  double *local_18e0;
  FabArray<amrex::EBCellFlagFab> *local_18d8;
  long local_18d0;
  int local_18c8;
  int local_18c4 [7];
  int *local_18a8;
  undefined4 local_189c;
  uint local_1898;
  long local_1890;
  char *local_1730;
  undefined4 local_1724;
  int *local_1720;
  undefined4 local_1714;
  int *local_1710;
  undefined4 local_1704;
  int *local_1700;
  value_type local_16f8;
  value_type local_16f0;
  value_type local_16e8;
  FArrayBox *local_16e0;
  FArrayBox *local_16d8;
  FArrayBox *local_16d0;
  long local_16c8;
  FArrayBox *local_16c0;
  FArrayBox *local_16b8;
  FArrayBox *local_16b0;
  long local_16a8;
  undefined4 local_16a0;
  int local_169c;
  int local_1698;
  undefined1 auStack_1690 [64];
  undefined1 auStack_1650 [64];
  double local_1610;
  undefined1 auStack_1608 [64];
  undefined1 auStack_15c8 [64];
  undefined1 auStack_1588 [64];
  undefined1 auStack_1548 [64];
  byte local_1508;
  byte local_1507;
  int local_14fc;
  int local_14f8;
  byte local_14f2;
  byte local_14f1;
  Box *local_14f0;
  int local_14e8;
  undefined4 local_14e4;
  double local_14e0;
  undefined1 *local_14d8;
  Array4<const_double> *local_14d0;
  Array4<const_double> *local_14c8;
  undefined1 *local_14c0;
  undefined1 *local_14b8;
  Array4<double> *local_14b0;
  undefined1 *local_14a8;
  undefined4 local_14a0;
  int local_149c;
  int local_1498;
  undefined1 auStack_1490 [64];
  undefined1 auStack_1450 [64];
  double local_1410;
  undefined1 auStack_1408 [64];
  undefined1 auStack_13c8 [64];
  undefined1 auStack_1388 [64];
  undefined1 auStack_1348 [64];
  byte local_1308;
  byte local_1307;
  int local_12fc;
  int local_12f8;
  byte local_12f2;
  byte local_12f1;
  Box *local_12f0;
  int local_12e8;
  undefined4 local_12e4;
  double local_12e0;
  undefined1 *local_12d8;
  Array4<const_double> *local_12d0;
  Array4<const_double> *local_12c8;
  undefined1 *local_12c0;
  undefined1 *local_12b8;
  Array4<double> *local_12b0;
  Box *local_12a8;
  undefined4 local_12a0;
  int local_129c;
  int local_1298;
  undefined1 auStack_1290 [64];
  undefined1 auStack_1250 [64];
  double local_1210;
  undefined1 auStack_1208 [64];
  undefined1 auStack_11c8 [64];
  undefined1 auStack_1188 [64];
  undefined1 auStack_1148 [64];
  byte local_1108;
  byte local_1107;
  int local_10fc;
  int local_10f8;
  byte local_10f2;
  byte local_10f1;
  Box *local_10f0;
  int local_10e8;
  undefined4 local_10e4;
  double local_10e0;
  undefined1 *local_10d8;
  Array4<const_double> *local_10d0;
  Array4<const_double> *local_10c8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  Array4<double> *local_10b0;
  Box *local_10a8;
  undefined4 local_10a0;
  int local_109c;
  int local_1098;
  undefined1 auStack_1090 [64];
  undefined1 auStack_1050 [64];
  double local_1010;
  undefined1 auStack_1008 [64];
  undefined1 auStack_fc8 [64];
  int local_f88;
  int local_f84;
  Box *local_f80;
  int local_f78;
  undefined4 local_f74;
  double local_f70;
  Array4<const_double> *local_f68;
  Array4<const_double> *local_f60;
  undefined1 *local_f58;
  Array4<double> *local_f50;
  Box *local_f48;
  undefined4 local_f40;
  int local_f3c;
  int local_f38;
  undefined1 auStack_f30 [64];
  undefined1 auStack_ef0 [64];
  double local_eb0;
  undefined1 auStack_ea8 [64];
  undefined1 auStack_e68 [64];
  int local_e28;
  int local_e24;
  Box *local_e20;
  int local_e18;
  undefined4 local_e14;
  double local_e10;
  Array4<const_double> *local_e08;
  Array4<const_double> *local_e00;
  anon_class_280_8_76b9537a *local_df8;
  Array4<double> *local_df0;
  Box *local_de8;
  undefined4 local_de0;
  int local_ddc;
  int local_dd8;
  undefined1 auStack_dd0 [64];
  undefined1 auStack_d90 [64];
  double local_d50;
  undefined1 auStack_d48 [64];
  undefined1 auStack_d08 [64];
  int local_cc8;
  int local_cc4;
  Box *local_cc0;
  int local_cb8;
  undefined4 local_cb4;
  double local_cb0;
  Array4<const_double> *local_ca8;
  Array4<const_double> *local_ca0;
  undefined1 *local_c98;
  Array4<double> *local_c90;
  Box *local_c88;
  undefined4 local_b5c;
  undefined1 *local_b58;
  int in_stack_fffffffffffff4b0;
  Dim3 local_a58;
  Dim3 local_a48;
  Dim3 local_a38;
  int local_a2c;
  Box *local_a28;
  double *local_a20;
  Dim3 local_a18;
  Box *local_a08;
  int local_a00;
  int iStack_9fc;
  int local_9f8;
  undefined4 local_9f4;
  Box *local_9f0;
  undefined4 local_9e4;
  Box *local_9e0;
  undefined4 local_9d4;
  Box *local_9d0;
  Dim3 local_9c8;
  Box *local_9b8;
  int local_9b0;
  int iStack_9ac;
  int local_9a8;
  undefined4 local_9a4;
  IntVect *local_9a0;
  undefined4 local_994;
  IntVect *local_990;
  undefined4 local_984;
  IntVect *local_980;
  Dim3 local_978;
  Dim3 local_968;
  Dim3 local_958;
  Dim3 local_948;
  int local_93c;
  Box *local_938;
  double *local_930;
  Dim3 local_928;
  Box *local_918;
  int local_910;
  int iStack_90c;
  int local_908;
  undefined4 local_904;
  Box *local_900;
  undefined4 local_8f4;
  Box *local_8f0;
  undefined4 local_8e4;
  Box *local_8e0;
  Dim3 local_8d8;
  Box *local_8c8;
  int local_8c0;
  int iStack_8bc;
  int local_8b8;
  undefined4 local_8b4;
  IntVect *local_8b0;
  undefined4 local_8a4;
  IntVect *local_8a0;
  undefined4 local_894;
  IntVect *local_890;
  Dim3 local_888;
  Dim3 local_874;
  Dim3 local_868;
  Dim3 local_858;
  int local_84c;
  Box *local_848;
  double *local_840;
  Dim3 local_838;
  Box *local_828;
  int local_820;
  int iStack_81c;
  int local_818;
  undefined4 local_814;
  Box *local_810;
  undefined4 local_804;
  Box *local_800;
  undefined4 local_7f4;
  Box *local_7f0;
  Dim3 local_7e8;
  Box *local_7d8;
  int local_7d0;
  int iStack_7cc;
  int local_7c8;
  undefined4 local_7c4;
  IntVect *local_7c0;
  undefined4 local_7b4;
  IntVect *local_7b0;
  undefined4 local_7a4;
  IntVect *local_7a0;
  Dim3 local_798;
  Dim3 local_788;
  Dim3 local_778;
  Dim3 local_768;
  int local_75c;
  undefined8 *local_758;
  double *local_750;
  Dim3 local_748;
  undefined8 *local_738;
  undefined4 local_730;
  undefined4 uStack_72c;
  int local_728;
  undefined4 local_724;
  undefined8 *local_720;
  undefined4 local_714;
  undefined8 *local_710;
  undefined4 local_704;
  undefined8 *local_700;
  Dim3 local_6f8;
  undefined8 *local_6e8;
  int local_6e0;
  int iStack_6dc;
  int local_6d8;
  undefined4 local_6d4;
  long local_6d0;
  undefined4 local_6c4;
  long local_6c0;
  undefined4 local_6b4;
  int *local_6b0;
  Dim3 local_6a8;
  Dim3 local_698;
  Dim3 local_688;
  Dim3 local_678;
  int local_66c;
  Box *local_668;
  double *local_660;
  Dim3 local_658;
  Box *local_648;
  int local_640;
  int iStack_63c;
  int local_638;
  undefined4 local_634;
  Box *local_630;
  undefined4 local_624;
  Box *local_620;
  undefined4 local_614;
  Box *local_610;
  Dim3 local_608;
  Box *local_5f8;
  int local_5f0;
  int iStack_5ec;
  int local_5e8;
  undefined4 local_5e4;
  IntVect *local_5e0;
  undefined4 local_5d4;
  IntVect *local_5d0;
  undefined4 local_5c4;
  IntVect *local_5c0;
  Dim3 local_5b8;
  Dim3 local_5a8;
  Dim3 local_598;
  Dim3 local_588;
  int local_57c;
  Box *local_578;
  double *local_570;
  Dim3 local_568;
  Box *local_558;
  int local_550;
  int iStack_54c;
  int local_548;
  undefined4 local_544;
  Box *local_540;
  undefined4 local_534;
  Box *local_530;
  undefined4 local_524;
  Box *local_520;
  Dim3 local_518;
  Box *local_508;
  int local_500;
  int iStack_4fc;
  int local_4f8;
  undefined4 local_4f4;
  IntVect *local_4f0;
  undefined4 local_4e4;
  IntVect *local_4e0;
  undefined4 local_4d4;
  IntVect *local_4d0;
  Dim3 local_4c8;
  Dim3 local_4b4;
  Dim3 local_4a8;
  Dim3 local_498;
  int local_48c;
  Box *local_488;
  double *local_480;
  Dim3 local_478;
  Box *local_468;
  int local_460;
  int iStack_45c;
  int local_458;
  undefined4 local_454;
  Box *local_450;
  undefined4 local_444;
  Box *local_440;
  undefined4 local_434;
  Box *local_430;
  Dim3 local_428;
  Box *local_418;
  int local_410;
  int iStack_40c;
  int local_408;
  undefined4 local_404;
  IntVect *local_400;
  undefined4 local_3f4;
  IntVect *local_3f0;
  undefined4 local_3e4;
  IntVect *local_3e0;
  Dim3 local_3d8;
  Dim3 local_3c8;
  Dim3 local_3b8;
  Dim3 local_3a8;
  int local_39c;
  undefined8 *local_398;
  double *local_390;
  Dim3 local_388;
  undefined8 *local_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  int local_368;
  undefined4 local_364;
  undefined8 *local_360;
  undefined4 local_354;
  undefined8 *local_350;
  undefined4 local_344;
  undefined8 *local_340;
  Dim3 local_338;
  undefined8 *local_328;
  int local_320;
  int iStack_31c;
  int local_318;
  undefined4 local_314;
  long local_310;
  undefined4 local_304;
  long local_300;
  undefined4 local_2f4;
  int *local_2f0;
  Dim3 local_2e8;
  Dim3 local_2d8;
  Dim3 local_2c8;
  Dim3 local_2b8;
  int local_2ac;
  Box *local_2a8;
  double *local_2a0;
  Dim3 local_298;
  Box *local_288;
  int local_280;
  int iStack_27c;
  int local_278;
  undefined4 local_274;
  Box *local_270;
  undefined4 local_264;
  Box *local_260;
  undefined4 local_254;
  Box *local_250;
  Dim3 local_248;
  Box *local_238;
  int local_230;
  int iStack_22c;
  int local_228;
  undefined4 local_224;
  IntVect *local_220;
  undefined4 local_214;
  IntVect *local_210;
  undefined4 local_204;
  IntVect *local_200;
  Dim3 local_1f8;
  Dim3 local_1e8;
  Dim3 local_1d8;
  Dim3 local_1c8;
  int local_1bc;
  Box *local_1b8;
  double *local_1b0;
  Dim3 local_1a8;
  Box *local_198;
  int local_190;
  int iStack_18c;
  int local_188;
  undefined4 local_184;
  Box *local_180;
  undefined4 local_174;
  Box *local_170;
  undefined4 local_164;
  Box *local_160;
  Dim3 local_158;
  Box *local_148;
  int local_140;
  int iStack_13c;
  int local_138;
  undefined4 local_134;
  IntVect *local_130;
  undefined4 local_124;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  Dim3 local_108;
  Dim3 local_f4;
  Dim3 local_e8;
  Dim3 local_d8;
  int local_cc;
  Box *local_c8;
  double *local_c0;
  Dim3 local_b8;
  Box *local_a8;
  int local_a0;
  int iStack_9c;
  int local_98;
  undefined4 local_94;
  Box *local_90;
  undefined4 local_84;
  Box *local_80;
  undefined4 local_74;
  Box *local_70;
  Dim3 local_68;
  Box *local_58;
  int local_50;
  int iStack_4c;
  int local_48;
  undefined4 local_44;
  IntVect *local_40;
  undefined4 local_34;
  IntVect *local_30;
  undefined4 local_24;
  IntVect *local_20;
  
  local_1898 = (uint)(in_R9D == 1);
  local_189c = 0;
  local_1890 = in_R8;
  MFIter::tilebox(in_stack_ffffffffffffdb00);
  local_18a8 = local_18c4;
  local_18c8 = (**(code **)(*in_RDI + 0x28))();
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  pFVar8 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_ffffffffffffdaa0);
  if (pFVar8 == (pointer)0x0) {
    local_2418 = 0;
  }
  else {
    local_2418 = __dynamic_cast(pFVar8,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
  }
  local_18d0 = local_2418;
  if (local_2418 == 0) {
    local_2420 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_2420 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                           ((EBFArrayBoxFactory *)in_stack_ffffffffffffdaa0);
  }
  local_18d8 = local_2420;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_ffffffffffffdaa0,
                       CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_18e0 = CoordSys::InvCellSize(&this_00->super_CoordSys);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_18e8 = FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdaa0,
                          (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_18f0 = FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdaa0,
                          (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdaa0,
             CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_18f8 = FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdaa0,
                          (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_1900 = Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>::operator[]
                         ((Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> *)
                          in_stack_ffffffffffffdaa0,
                          CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_1700 = local_18a8;
  local_1704 = 0;
  local_1924._0_4_ = local_18a8[0];
  local_1924._4_4_ = local_18a8[1];
  local_1924._8_8_ = *(undefined8 *)(local_18a8 + 2);
  local_1924._16_8_ = *(undefined8 *)(local_18a8 + 4);
  local_1924._24_4_ = local_18a8[6];
  local_b58 = local_1924;
  local_b5c = 0;
  if ((local_1924._24_4_ & 1) == 0) {
    local_1924._24_4_ = local_1924._24_4_ | 1;
  }
  local_1908 = (Box *)local_1924;
  local_1710 = local_18a8;
  local_1714 = 1;
  local_194c.smallend.vect._0_8_ = *(undefined8 *)local_18a8;
  local_194c.smallend.vect[2] = local_18a8[2];
  local_194c.bigend.vect[0] = local_18a8[3];
  local_194c.bigend.vect._4_8_ = *(undefined8 *)(local_18a8 + 4);
  local_194c.btype.itype = local_18a8[6];
  if ((local_194c.btype.itype & 2) == 0) {
    local_194c.btype.itype = local_194c.btype.itype | 2;
  }
  local_1930 = &local_194c;
  local_1720 = local_18a8;
  local_1724 = 2;
  local_1974._0_8_ = *(undefined8 *)local_18a8;
  local_1974._8_8_ = *(undefined8 *)(local_18a8 + 2);
  local_1974._16_8_ = *(undefined8 *)(local_18a8 + 4);
  local_1974._24_4_ = local_18a8[6];
  this_04 = (EBCellFlagFab *)local_1974;
  if ((local_1974._24_4_ & 4) == 0) {
    local_1974._24_4_ = local_1974._24_4_ | 4;
  }
  local_1974._28_8_ = local_1974;
  ppFVar9 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffdaa0,
                       CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_16e8 = *ppFVar9;
  local_a20 = (local_16e8->super_BaseFab<double>).dptr;
  local_a28 = &(local_16e8->super_BaseFab<double>).domain;
  local_a2c = (local_16e8->super_BaseFab<double>).nvar;
  local_9d4 = 0;
  local_a00 = (local_a28->smallend).vect[0];
  local_9e4 = 1;
  iStack_9fc = (local_16e8->super_BaseFab<double>).domain.smallend.vect[1];
  local_a48.x = (local_a28->smallend).vect[0];
  local_a48.y = (local_a28->smallend).vect[1];
  local_9f4 = 2;
  local_a48.z = (local_16e8->super_BaseFab<double>).domain.smallend.vect[2];
  local_980 = &(local_16e8->super_BaseFab<double>).domain.bigend;
  local_984 = 0;
  local_9b0 = local_980->vect[0] + 1;
  local_990 = &(local_16e8->super_BaseFab<double>).domain.bigend;
  local_994 = 1;
  iStack_9ac = (local_16e8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_9a0 = &(local_16e8->super_BaseFab<double>).domain.bigend;
  local_9a4 = 2;
  local_a58.z = (local_16e8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_a58.y = iStack_9ac;
  local_a58.x = local_9b0;
  local_a38._0_8_ = local_a48._0_8_;
  local_a38.z = local_a48.z;
  local_a18._0_8_ = local_a48._0_8_;
  local_a18.z = local_a48.z;
  local_a08 = local_a28;
  local_9f8 = local_a48.z;
  local_9f0 = local_a28;
  local_9e0 = local_a28;
  local_9d0 = local_a28;
  local_9c8._0_8_ = local_a58._0_8_;
  local_9c8.z = local_a58.z;
  local_9b8 = local_a28;
  local_9a8 = local_a58.z;
  Array4<double>::Array4(&local_19c0,local_a20,&local_a38,&local_a58,local_a2c);
  local_1980 = &local_19c0;
  ppFVar9 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffdaa0,
                       CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_16f0 = *ppFVar9;
  local_930 = (local_16f0->super_BaseFab<double>).dptr;
  local_938 = &(local_16f0->super_BaseFab<double>).domain;
  local_93c = (local_16f0->super_BaseFab<double>).nvar;
  local_8e4 = 0;
  local_910 = (local_938->smallend).vect[0];
  local_8f4 = 1;
  iStack_90c = (local_16f0->super_BaseFab<double>).domain.smallend.vect[1];
  local_958.x = (local_938->smallend).vect[0];
  local_958.y = (local_938->smallend).vect[1];
  local_904 = 2;
  local_958.z = (local_16f0->super_BaseFab<double>).domain.smallend.vect[2];
  local_890 = &(local_16f0->super_BaseFab<double>).domain.bigend;
  local_894 = 0;
  local_8c0 = local_890->vect[0] + 1;
  local_8a0 = &(local_16f0->super_BaseFab<double>).domain.bigend;
  local_8a4 = 1;
  iStack_8bc = (local_16f0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_8b0 = &(local_16f0->super_BaseFab<double>).domain.bigend;
  local_8b4 = 2;
  local_978.z = (local_16f0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_978.y = iStack_8bc;
  local_978.x = local_8c0;
  this_03 = &local_1a08;
  local_968._0_8_ = local_978._0_8_;
  local_968.z = local_978.z;
  local_948._0_8_ = local_958._0_8_;
  local_948.z = local_958.z;
  local_928._0_8_ = local_958._0_8_;
  local_928.z = local_958.z;
  local_918 = local_938;
  local_908 = local_958.z;
  local_900 = local_938;
  local_8f0 = local_938;
  local_8e0 = local_938;
  local_8d8._0_8_ = local_978._0_8_;
  local_8d8.z = local_978.z;
  local_8c8 = local_938;
  local_8b8 = local_978.z;
  Array4<double>::Array4(this_03,local_930,&local_948,&local_968,local_93c);
  local_19c8 = this_03;
  ppFVar9 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffdaa0,
                       CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
  local_16f8 = *ppFVar9;
  local_840 = (local_16f8->super_BaseFab<double>).dptr;
  local_848 = &(local_16f8->super_BaseFab<double>).domain;
  local_84c = (local_16f8->super_BaseFab<double>).nvar;
  local_7f4 = 0;
  local_820 = (local_848->smallend).vect[0];
  local_804 = 1;
  iStack_81c = (local_16f8->super_BaseFab<double>).domain.smallend.vect[1];
  local_868.x = (local_848->smallend).vect[0];
  local_868.y = (local_848->smallend).vect[1];
  local_814 = 2;
  local_868.z = (local_16f8->super_BaseFab<double>).domain.smallend.vect[2];
  local_7a0 = &(local_16f8->super_BaseFab<double>).domain.bigend;
  local_7a4 = 0;
  local_7d0 = local_7a0->vect[0] + 1;
  local_7b0 = &(local_16f8->super_BaseFab<double>).domain.bigend;
  local_7b4 = 1;
  iStack_7cc = (local_16f8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_7c0 = &(local_16f8->super_BaseFab<double>).domain.bigend;
  local_7c4 = 2;
  local_888.z = (local_16f8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_888.y = iStack_7cc;
  local_888.x = local_7d0;
  local_874._0_8_ = local_888._0_8_;
  local_874.z = local_888.z;
  local_858._0_8_ = local_868._0_8_;
  local_858.z = local_868.z;
  local_838._0_8_ = local_868._0_8_;
  local_838.z = local_868.z;
  local_828 = local_848;
  local_818 = local_868.z;
  local_810 = local_848;
  local_800 = local_848;
  local_7f0 = local_848;
  local_7e8._0_8_ = local_888._0_8_;
  local_7e8.z = local_888.z;
  local_7d8 = local_848;
  local_7c8 = local_888.z;
  Array4<double>::Array4(&local_1a50,local_840,&local_858,&local_874,local_84c);
  local_1a10 = &local_1a50;
  if (local_18d8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
    local_244c = regular;
  }
  else {
    FabArray<amrex::EBCellFlagFab>::operator[]
              ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_244c = EBCellFlagFab::getType(this_04,(Box *)this_03);
  }
  local_1a54 = local_244c;
  if (local_244c == covered) {
    iVar1 = (local_1908->smallend).vect[0];
    iVar2 = (local_1908->smallend).vect[1];
    iVar3 = (local_1908->smallend).vect[2];
    iVar4 = (local_1908->bigend).vect[0];
    iVar5 = (local_1908->bigend).vect[1];
    iVar6 = (local_1908->bigend).vect[2];
    for (local_1a94 = 0; local_1a98 = iVar3, local_1a94 < local_18c8; local_1a94 = local_1a94 + 1) {
      for (; local_1a9c = iVar2, local_1a98 <= iVar6; local_1a98 = local_1a98 + 1) {
        for (; local_1aa0 = iVar1, local_1a9c <= iVar5; local_1a9c = local_1a9c + 1) {
          for (; local_1aa0 <= iVar4; local_1aa0 = local_1aa0 + 1) {
            local_1980->p
            [(long)(local_1aa0 - (local_1980->begin).x) +
             (long)(local_1a9c - (local_1980->begin).y) * local_1980->jstride +
             (long)(local_1a98 - (local_1980->begin).z) * local_1980->kstride +
             (long)local_1a94 * local_1980->nstride] = 0.0;
          }
        }
      }
    }
    iVar1 = (local_1930->smallend).vect[0];
    iVar2 = (local_1930->smallend).vect[1];
    iVar3 = (local_1930->smallend).vect[2];
    iVar4 = (local_1930->bigend).vect[0];
    iVar5 = (local_1930->bigend).vect[1];
    iVar6 = (local_1930->bigend).vect[2];
    for (local_1ae4 = 0; local_1ae8 = iVar3, local_1ae4 < local_18c8; local_1ae4 = local_1ae4 + 1) {
      for (; local_1aec = iVar2, local_1ae8 <= iVar6; local_1ae8 = local_1ae8 + 1) {
        for (; local_1af0 = iVar1, local_1aec <= iVar5; local_1aec = local_1aec + 1) {
          for (; local_1af0 <= iVar4; local_1af0 = local_1af0 + 1) {
            local_19c8->p
            [(long)(local_1af0 - (local_19c8->begin).x) +
             (long)(local_1aec - (local_19c8->begin).y) * local_19c8->jstride +
             (long)(local_1ae8 - (local_19c8->begin).z) * local_19c8->kstride +
             (long)local_1ae4 * local_19c8->nstride] = 0.0;
          }
        }
      }
    }
    iVar1 = ((IntVect *)local_1974._28_8_)->vect[0];
    iVar2 = ((IntVect *)local_1974._28_8_)->vect[1];
    iVar3 = ((IntVect *)local_1974._28_8_)->vect[2];
    iVar4 = ((IntVect *)(local_1974._28_8_ + 0xc))->vect[0];
    iVar5 = ((IntVect *)(local_1974._28_8_ + 0xc))->vect[1];
    iVar6 = ((IntVect *)(local_1974._28_8_ + 0xc))->vect[2];
    for (local_1b34 = 0; local_1b38 = iVar3, local_1b34 < local_18c8; local_1b34 = local_1b34 + 1) {
      for (; local_1b3c = iVar2, local_1b38 <= iVar6; local_1b38 = local_1b38 + 1) {
        for (; local_1b40 = iVar1, local_1b3c <= iVar5; local_1b3c = local_1b3c + 1) {
          for (; local_1b40 <= iVar4; local_1b40 = local_1b40 + 1) {
            local_1a10->p
            [(long)(local_1b40 - (local_1a10->begin).x) +
             (long)(local_1b3c - (local_1a10->begin).y) * local_1a10->jstride +
             (long)(local_1b38 - (local_1a10->begin).z) * local_1a10->kstride +
             (long)local_1b34 * local_1a10->nstride] = 0.0;
          }
        }
      }
    }
  }
  else if (local_244c == regular) {
    local_1b58 = local_18e8;
    local_1b50 = local_18f0;
    local_1b48 = local_18f8;
    MLABecLaplacian::FFlux
              (in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,
               in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8,
               in_stack_ffffffffffffe0a4,in_stack_fffffffffffff4b0);
  }
  else if (local_1898 == 0) {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdaa0);
    local_2058 = local_2070;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_2078 = local_20b8;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    f = (anon_class_280_8_76b9537a *)local_2100;
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_2100._64_8_ = f;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    puVar10 = local_2148;
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_16c8 = local_1890;
    local_390 = *(double **)(local_1890 + 0x10);
    local_398 = (undefined8 *)(local_1890 + 0x18);
    local_39c = *(int *)(local_1890 + 0x34);
    local_344 = 0;
    local_370 = *(undefined4 *)local_398;
    local_354 = 1;
    uStack_36c = *(undefined4 *)(local_1890 + 0x1c);
    local_3b8._0_8_ = *local_398;
    local_364 = 2;
    local_3b8.z = *(int *)(local_1890 + 0x20);
    local_2f0 = (int *)(local_1890 + 0x24);
    local_2f4 = 0;
    local_320 = *local_2f0 + 1;
    local_300 = local_1890 + 0x24;
    local_304 = 1;
    iStack_31c = *(int *)(local_1890 + 0x28) + 1;
    local_310 = local_1890 + 0x24;
    local_314 = 2;
    local_3d8.z = *(int *)(local_1890 + 0x2c) + 1;
    local_3d8.y = iStack_31c;
    local_3d8.x = local_320;
    this_01 = &local_2190;
    local_2108 = puVar10;
    local_3c8._0_8_ = local_3d8._0_8_;
    local_3c8.z = local_3d8.z;
    local_3a8._0_8_ = local_3b8._0_8_;
    local_3a8.z = local_3b8.z;
    local_388._0_8_ = local_3b8._0_8_;
    local_388.z = local_3b8.z;
    local_378 = local_398;
    local_368 = local_3b8.z;
    local_360 = local_398;
    local_350 = local_398;
    local_340 = local_398;
    local_338._0_8_ = local_3d8._0_8_;
    local_338.z = local_3d8.z;
    local_328 = local_398;
    local_318 = local_3d8.z;
    Array4<const_double>::Array4(this_01,local_390,&local_3a8,&local_3c8,local_39c);
    local_16d0 = local_18e8;
    local_2a0 = (local_18e8->super_BaseFab<double>).dptr;
    local_2a8 = &(local_18e8->super_BaseFab<double>).domain;
    local_2ac = (local_18e8->super_BaseFab<double>).nvar;
    local_254 = 0;
    local_280 = (local_2a8->smallend).vect[0];
    local_264 = 1;
    iStack_27c = (local_18e8->super_BaseFab<double>).domain.smallend.vect[1];
    local_2c8.x = (local_2a8->smallend).vect[0];
    local_2c8.y = (local_2a8->smallend).vect[1];
    local_274 = 2;
    local_2c8.z = (local_18e8->super_BaseFab<double>).domain.smallend.vect[2];
    local_200 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_204 = 0;
    local_230 = local_200->vect[0] + 1;
    local_210 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_214 = 1;
    iStack_22c = (local_18e8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_220 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_224 = 2;
    local_2e8.z = (local_18e8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_2e8.y = iStack_22c;
    local_2e8.x = local_230;
    this_02 = &local_21d8;
    local_2150 = this_01;
    local_2d8._0_8_ = local_2e8._0_8_;
    local_2d8.z = local_2e8.z;
    local_2b8._0_8_ = local_2c8._0_8_;
    local_2b8.z = local_2c8.z;
    local_298._0_8_ = local_2c8._0_8_;
    local_298.z = local_2c8.z;
    local_288 = local_2a8;
    local_278 = local_2c8.z;
    local_270 = local_2a8;
    local_260 = local_2a8;
    local_250 = local_2a8;
    local_248._0_8_ = local_2e8._0_8_;
    local_248.z = local_2e8.z;
    local_238 = local_2a8;
    local_228 = local_2e8.z;
    Array4<const_double>::Array4(this_02,local_2a0,&local_2b8,&local_2d8,local_2ac);
    local_16d8 = local_18f0;
    local_1b0 = (local_18f0->super_BaseFab<double>).dptr;
    local_1b8 = &(local_18f0->super_BaseFab<double>).domain;
    local_1bc = (local_18f0->super_BaseFab<double>).nvar;
    local_164 = 0;
    local_190 = (local_1b8->smallend).vect[0];
    local_174 = 1;
    iStack_18c = (local_18f0->super_BaseFab<double>).domain.smallend.vect[1];
    local_1d8.x = (local_1b8->smallend).vect[0];
    local_1d8.y = (local_1b8->smallend).vect[1];
    local_184 = 2;
    local_1d8.z = (local_18f0->super_BaseFab<double>).domain.smallend.vect[2];
    local_110 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_114 = 0;
    local_140 = local_110->vect[0] + 1;
    local_120 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_124 = 1;
    iStack_13c = (local_18f0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_130 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_134 = 2;
    local_1f8.z = (local_18f0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_1f8.y = iStack_13c;
    local_1f8.x = local_140;
    local_2198 = this_02;
    local_1e8._0_8_ = local_1f8._0_8_;
    local_1e8.z = local_1f8.z;
    local_1c8._0_8_ = local_1d8._0_8_;
    local_1c8.z = local_1d8.z;
    local_1a8._0_8_ = local_1d8._0_8_;
    local_1a8.z = local_1d8.z;
    local_198 = local_1b8;
    local_188 = local_1d8.z;
    local_180 = local_1b8;
    local_170 = local_1b8;
    local_160 = local_1b8;
    local_158._0_8_ = local_1f8._0_8_;
    local_158.z = local_1f8.z;
    local_148 = local_1b8;
    local_138 = local_1f8.z;
    Array4<const_double>::Array4(&local_2220,local_1b0,&local_1c8,&local_1e8,local_1bc);
    local_16e0 = local_18f8;
    local_c0 = (local_18f8->super_BaseFab<double>).dptr;
    local_c8 = &(local_18f8->super_BaseFab<double>).domain;
    local_cc = (local_18f8->super_BaseFab<double>).nvar;
    local_74 = 0;
    local_a0 = (local_c8->smallend).vect[0];
    local_84 = 1;
    iStack_9c = (local_18f8->super_BaseFab<double>).domain.smallend.vect[1];
    local_e8.x = (local_c8->smallend).vect[0];
    local_e8.y = (local_c8->smallend).vect[1];
    local_94 = 2;
    local_e8.z = (local_18f8->super_BaseFab<double>).domain.smallend.vect[2];
    local_20 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_24 = 0;
    local_50 = local_20->vect[0] + 1;
    local_30 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_34 = 1;
    iStack_4c = (local_18f8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_40 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_44 = 2;
    local_108.z = (local_18f8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_108.y = iStack_4c;
    local_108.x = local_50;
    local_21e0 = &local_2220;
    local_f4._0_8_ = local_108._0_8_;
    local_f4.z = local_108.z;
    local_d8._0_8_ = local_e8._0_8_;
    local_d8.z = local_e8.z;
    local_b8._0_8_ = local_e8._0_8_;
    local_b8.z = local_e8.z;
    local_a8 = local_c8;
    local_98 = local_e8.z;
    local_90 = local_c8;
    local_80 = local_c8;
    local_70 = local_c8;
    local_68._0_8_ = local_108._0_8_;
    local_68.z = local_108.z;
    local_58 = local_c8;
    local_48 = local_108.z;
    Array4<const_double>::Array4(&local_2268,local_c0,&local_d8,&local_f4,local_cc);
    local_2228 = &local_2268;
    local_2270 = (double)in_RDI[0x67] * *local_18e0;
    local_2278 = (double)in_RDI[0x67] * local_18e0[1];
    local_2280 = (double)in_RDI[0x67] * local_18e0[2];
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    local_2288 = local_22b0;
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_22c8,&local_22e0), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_22fc,&local_22c8);
      local_f48 = &local_22fc;
      local_f50 = local_1980;
      local_f58 = local_2078;
      local_f60 = local_2150;
      local_f68 = local_2198;
      local_f70 = local_2270;
      local_f74 = in_stack_00000008;
      local_f78 = local_18c8;
      local_f80 = local_1908;
      local_f84 = Box::smallEnd(local_1908,0);
      local_1098 = Box::bigEnd(local_f80,0);
      local_10a0 = local_f74;
      local_109c = local_f84;
      local_f88 = local_1098;
      memcpy(auStack_1090,local_f58,0x3c);
      memcpy(auStack_1050,local_f50,0x3c);
      local_1010 = local_f70;
      memcpy(auStack_1008,local_f68,0x3c);
      memcpy(auStack_fc8,local_f60,0x3c);
      LoopConcurrent<amrex::mlebabeclap_flux_x_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)this_01,(int)((ulong)puVar10 >> 0x20),f);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_22c8);
    }
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    local_2308 = local_2330;
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_2348,&local_2360), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_237c,&local_2348);
      local_de8 = &local_237c;
      local_df0 = local_19c8;
      local_df8 = (anon_class_280_8_76b9537a *)local_2100._64_8_;
      local_e00 = local_2150;
      local_e08 = local_21e0;
      local_e10 = local_2278;
      local_e14 = in_stack_00000008;
      local_e18 = local_18c8;
      local_e20 = local_1930;
      local_e24 = Box::smallEnd(local_1930,1);
      local_f38 = Box::bigEnd(local_e20,1);
      local_f40 = local_e14;
      local_f3c = local_e24;
      local_e28 = local_f38;
      memcpy(auStack_f30,local_df8,0x3c);
      memcpy(auStack_ef0,local_df0,0x3c);
      local_eb0 = local_e10;
      memcpy(auStack_ea8,local_e08,0x3c);
      memcpy(auStack_e68,local_e00,0x3c);
      LoopConcurrent<amrex::mlebabeclap_flux_y_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)this_01,(int)((ulong)puVar10 >> 0x20),(anon_class_280_8_76c7e33a *)f);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2348);
    }
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    local_2388 = local_23b0;
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_23c8,&local_23e0), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_23fc,&local_23c8);
      local_c88 = &local_23fc;
      local_c90 = local_1a10;
      local_c98 = local_2108;
      local_ca0 = local_2150;
      local_ca8 = local_2228;
      local_cb0 = local_2280;
      local_cb4 = in_stack_00000008;
      local_cb8 = local_18c8;
      local_cc0 = (Box *)local_1974._28_8_;
      local_cc4 = Box::smallEnd((Box *)local_1974._28_8_,2);
      local_dd8 = Box::bigEnd(local_cc0,2);
      local_de0 = local_cb4;
      local_ddc = local_cc4;
      local_cc8 = local_dd8;
      memcpy(auStack_dd0,local_c98,0x3c);
      memcpy(auStack_d90,local_c90,0x3c);
      local_d50 = local_cb0;
      memcpy(auStack_d48,local_ca8,0x3c);
      memcpy(auStack_d08,local_ca0,0x3c);
      LoopConcurrent<amrex::mlebabeclap_flux_z_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)this_01,(int)((ulong)puVar10 >> 0x20),(anon_class_280_8_76d672fa *)f);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_23c8);
    }
  }
  else {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdaa0);
    local_1b60 = local_1b78;
    EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdaa0);
    local_1b80 = local_1b98;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_1ba0 = local_1be0;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_1be8 = local_1c28;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_1c30 = local_1c70;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_1c78 = local_1cb8;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_1cc0 = local_1d00;
    std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdaa0,
               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    MultiCutFab::const_array
              (in_stack_ffffffffffffdaa0,
               (MFIter *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
    local_16a8 = local_1890;
    local_750 = *(double **)(local_1890 + 0x10);
    local_758 = (undefined8 *)(local_1890 + 0x18);
    local_75c = *(int *)(local_1890 + 0x34);
    local_704 = 0;
    local_730 = *(undefined4 *)local_758;
    local_714 = 1;
    uStack_72c = *(undefined4 *)(local_1890 + 0x1c);
    local_778._0_8_ = *local_758;
    local_724 = 2;
    local_778.z = *(int *)(local_1890 + 0x20);
    local_6b0 = (int *)(local_1890 + 0x24);
    local_6b4 = 0;
    local_6e0 = *local_6b0 + 1;
    local_6c0 = local_1890 + 0x24;
    local_6c4 = 1;
    iStack_6dc = *(int *)(local_1890 + 0x28) + 1;
    local_6d0 = local_1890 + 0x24;
    local_6d4 = 2;
    local_798.z = *(int *)(local_1890 + 0x2c) + 1;
    local_798.y = iStack_6dc;
    local_798.x = local_6e0;
    local_1d08 = local_1d48;
    local_788._0_8_ = local_798._0_8_;
    local_788.z = local_798.z;
    local_768._0_8_ = local_778._0_8_;
    local_768.z = local_778.z;
    local_748._0_8_ = local_778._0_8_;
    local_748.z = local_778.z;
    local_738 = local_758;
    local_728 = local_778.z;
    local_720 = local_758;
    local_710 = local_758;
    local_700 = local_758;
    local_6f8._0_8_ = local_798._0_8_;
    local_6f8.z = local_798.z;
    local_6e8 = local_758;
    local_6d8 = local_798.z;
    Array4<const_double>::Array4(&local_1d90,local_750,&local_768,&local_788,local_75c);
    local_16b0 = local_18e8;
    local_660 = (local_18e8->super_BaseFab<double>).dptr;
    local_668 = &(local_18e8->super_BaseFab<double>).domain;
    local_66c = (local_18e8->super_BaseFab<double>).nvar;
    local_614 = 0;
    local_640 = (local_668->smallend).vect[0];
    local_624 = 1;
    iStack_63c = (local_18e8->super_BaseFab<double>).domain.smallend.vect[1];
    local_688.x = (local_668->smallend).vect[0];
    local_688.y = (local_668->smallend).vect[1];
    local_634 = 2;
    local_688.z = (local_18e8->super_BaseFab<double>).domain.smallend.vect[2];
    local_5c0 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_5c4 = 0;
    local_5f0 = local_5c0->vect[0] + 1;
    local_5d0 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_5d4 = 1;
    iStack_5ec = (local_18e8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_5e0 = &(local_18e8->super_BaseFab<double>).domain.bigend;
    local_5e4 = 2;
    local_6a8.z = (local_18e8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_6a8.y = iStack_5ec;
    local_6a8.x = local_5f0;
    local_1d50 = &local_1d90;
    local_698._0_8_ = local_6a8._0_8_;
    local_698.z = local_6a8.z;
    local_678._0_8_ = local_688._0_8_;
    local_678.z = local_688.z;
    local_658._0_8_ = local_688._0_8_;
    local_658.z = local_688.z;
    local_648 = local_668;
    local_638 = local_688.z;
    local_630 = local_668;
    local_620 = local_668;
    local_610 = local_668;
    local_608._0_8_ = local_6a8._0_8_;
    local_608.z = local_6a8.z;
    local_5f8 = local_668;
    local_5e8 = local_6a8.z;
    Array4<const_double>::Array4(&local_1dd8,local_660,&local_678,&local_698,local_66c);
    local_16b8 = local_18f0;
    local_570 = (local_18f0->super_BaseFab<double>).dptr;
    local_578 = &(local_18f0->super_BaseFab<double>).domain;
    local_57c = (local_18f0->super_BaseFab<double>).nvar;
    local_524 = 0;
    local_550 = (local_578->smallend).vect[0];
    local_534 = 1;
    iStack_54c = (local_18f0->super_BaseFab<double>).domain.smallend.vect[1];
    local_598.x = (local_578->smallend).vect[0];
    local_598.y = (local_578->smallend).vect[1];
    local_544 = 2;
    local_598.z = (local_18f0->super_BaseFab<double>).domain.smallend.vect[2];
    local_4d0 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_4d4 = 0;
    local_500 = local_4d0->vect[0] + 1;
    local_4e0 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_4e4 = 1;
    iStack_4fc = (local_18f0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_4f0 = &(local_18f0->super_BaseFab<double>).domain.bigend;
    local_4f4 = 2;
    local_5b8.z = (local_18f0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_5b8.y = iStack_4fc;
    local_5b8.x = local_500;
    local_1d98 = &local_1dd8;
    local_5a8._0_8_ = local_5b8._0_8_;
    local_5a8.z = local_5b8.z;
    local_588._0_8_ = local_598._0_8_;
    local_588.z = local_598.z;
    local_568._0_8_ = local_598._0_8_;
    local_568.z = local_598.z;
    local_558 = local_578;
    local_548 = local_598.z;
    local_540 = local_578;
    local_530 = local_578;
    local_520 = local_578;
    local_518._0_8_ = local_5b8._0_8_;
    local_518.z = local_5b8.z;
    local_508 = local_578;
    local_4f8 = local_5b8.z;
    Array4<const_double>::Array4(&local_1e20,local_570,&local_588,&local_5a8,local_57c);
    local_16c0 = local_18f8;
    local_480 = (local_18f8->super_BaseFab<double>).dptr;
    local_488 = &(local_18f8->super_BaseFab<double>).domain;
    local_48c = (local_18f8->super_BaseFab<double>).nvar;
    local_434 = 0;
    local_460 = (local_488->smallend).vect[0];
    local_444 = 1;
    iStack_45c = (local_18f8->super_BaseFab<double>).domain.smallend.vect[1];
    local_4a8.x = (local_488->smallend).vect[0];
    local_4a8.y = (local_488->smallend).vect[1];
    local_454 = 2;
    local_4a8.z = (local_18f8->super_BaseFab<double>).domain.smallend.vect[2];
    local_3e0 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_3e4 = 0;
    local_410 = local_3e0->vect[0] + 1;
    local_3f0 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_3f4 = 1;
    iStack_40c = (local_18f8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_400 = &(local_18f8->super_BaseFab<double>).domain.bigend;
    local_404 = 2;
    local_4c8.z = (local_18f8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_4c8.y = iStack_40c;
    local_4c8.x = local_410;
    local_1de0 = &local_1e20;
    local_4b4._0_8_ = local_4c8._0_8_;
    local_4b4.z = local_4c8.z;
    local_498._0_8_ = local_4a8._0_8_;
    local_498.z = local_4a8.z;
    local_478._0_8_ = local_4a8._0_8_;
    local_478.z = local_4a8.z;
    local_468 = local_488;
    local_458 = local_4a8.z;
    local_450 = local_488;
    local_440 = local_488;
    local_430 = local_488;
    local_428._0_8_ = local_4c8._0_8_;
    local_428.z = local_4c8.z;
    local_418 = local_488;
    local_408 = local_4c8.z;
    Array4<const_double>::Array4(&local_1e68,local_480,&local_498,&local_4b4,local_48c);
    local_1e28 = &local_1e68;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (in_stack_ffffffffffffdaa8,(MFIter *)in_stack_ffffffffffffdaa0);
    local_1e70 = local_1eb0;
    local_1eb8 = (double)in_RDI[0x67] * *local_18e0;
    local_1ec0 = (double)in_RDI[0x67] * local_18e0[1];
    local_1ec8 = (double)in_RDI[0x67] * local_18e0[2];
    local_1ec9 = (int)in_RDI[0x65] == 1;
    local_1eca = *(int *)((long)in_RDI + 0x32c) == 3;
    if ((bool)local_1eca) {
      local_1730 = "phi_on_centroid is still a WIP";
      Abort_host((char *)CONCAT44(in_stack_ffffffffffffdab4,in_stack_ffffffffffffdab0));
    }
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    local_1ed8 = local_1f00;
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_1f18,(iterator *)&stack0xffffffffffffe0d0), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                ((Box *)&stack0xffffffffffffe0b4,&local_1f18);
      local_14a8 = &stack0xffffffffffffe0b4;
      local_14b0 = local_1980;
      local_14b8 = local_1ba0;
      local_14c0 = local_1c78;
      local_14c8 = local_1d50;
      local_14d0 = local_1d98;
      local_14d8 = local_1e70;
      local_14e0 = local_1eb8;
      local_14e4 = in_stack_00000008;
      local_14e8 = local_18c8;
      local_14f0 = local_1908;
      local_14f1 = local_1ec9 & 1;
      local_14f2 = local_1eca & 1;
      local_14f8 = Box::smallEnd(local_1908,0);
      local_1698 = Box::bigEnd(local_14f0,0);
      local_16a0 = local_14e4;
      local_169c = local_14f8;
      local_14fc = local_1698;
      memcpy(auStack_1690,local_14b8,0x3c);
      memcpy(auStack_1650,local_14b0,0x3c);
      local_1610 = local_14e0;
      memcpy(auStack_1608,local_14d0,0x3c);
      memcpy(auStack_15c8,local_14c8,0x3c);
      memcpy(auStack_1588,local_14c0,0x3c);
      memcpy(auStack_1548,local_14d8,0x3c);
      local_1508 = local_14f1 & 1;
      local_1507 = local_14f2 & 1;
      LoopConcurrent<amrex::mlebabeclap_flux_x(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                (in_stack_ffffffffffffdaf8,(int)((ulong)in_stack_ffffffffffffdaf0 >> 0x20),
                 in_stack_ffffffffffffdae8);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1f18);
    }
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (local_1f98,&local_1fb0), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_1fcc,local_1f98);
      local_12a8 = &local_1fcc;
      local_12b0 = local_19c8;
      local_12b8 = local_1be8;
      local_12c0 = local_1cc0;
      local_12c8 = local_1d50;
      local_12d0 = local_1de0;
      local_12d8 = local_1e70;
      local_12e0 = local_1ec0;
      local_12e4 = in_stack_00000008;
      local_12e8 = local_18c8;
      local_12f0 = local_1930;
      local_12f1 = local_1ec9 & 1;
      local_12f2 = local_1eca & 1;
      local_12f8 = Box::smallEnd(local_1930,1);
      local_1498 = Box::bigEnd(local_12f0,1);
      local_14a0 = local_12e4;
      local_149c = local_12f8;
      local_12fc = local_1498;
      memcpy(auStack_1490,local_12b8,0x3c);
      memcpy(auStack_1450,local_12b0,0x3c);
      local_1410 = local_12e0;
      memcpy(auStack_1408,local_12d0,0x3c);
      memcpy(auStack_13c8,local_12c8,0x3c);
      memcpy(auStack_1388,local_12c0,0x3c);
      memcpy(auStack_1348,local_12d8,0x3c);
      local_1308 = local_12f1 & 1;
      local_1307 = local_12f2 & 1;
      LoopConcurrent<amrex::mlebabeclap_flux_y(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                (in_stack_ffffffffffffdaf8,(int)((ulong)in_stack_ffffffffffffdaf0 >> 0x20),
                 (anon_class_416_12_3e7d91eb *)in_stack_ffffffffffffdae8);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(local_1f98);
    }
    Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffdaa0);
    local_1fd8 = local_2000;
    Gpu::range_detail::range_impl<amrex::Box>::begin
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    Gpu::range_detail::range_impl<amrex::Box>::end
              ((range_impl<amrex::Box> *)in_stack_ffffffffffffdaa0);
    while (bVar7 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_2018,&local_2030), bVar7) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_204c,&local_2018);
      local_10a8 = &local_204c;
      local_10b0 = local_1a10;
      local_10b8 = local_1c30;
      local_10c0 = local_1d08;
      local_10c8 = local_1d50;
      local_10d0 = local_1e28;
      local_10d8 = local_1e70;
      local_10e0 = local_1ec8;
      local_10e4 = in_stack_00000008;
      local_10e8 = local_18c8;
      local_10f0 = (Box *)local_1974._28_8_;
      local_10f1 = local_1ec9 & 1;
      local_10f2 = local_1eca & 1;
      local_10f8 = Box::smallEnd((Box *)local_1974._28_8_,2);
      local_1298 = Box::bigEnd(local_10f0,2);
      local_12a0 = local_10e4;
      local_129c = local_10f8;
      local_10fc = local_1298;
      memcpy(auStack_1290,local_10b8,0x3c);
      memcpy(auStack_1250,local_10b0,0x3c);
      local_1210 = local_10e0;
      memcpy(auStack_1208,local_10d0,0x3c);
      memcpy(auStack_11c8,local_10c8,0x3c);
      memcpy(auStack_1188,local_10c0,0x3c);
      memcpy(auStack_1148,local_10d8,0x3c);
      local_1108 = local_10f1 & 1;
      local_1107 = local_10f2 & 1;
      LoopConcurrent<amrex::mlebabeclap_flux_z(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                (in_stack_ffffffffffffdaf8,(int)((ulong)in_stack_ffffffffffffdaf0 >> 0x20),
                 (anon_class_416_12_713eb60a *)in_stack_ffffffffffffdae8);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2018);
    }
  }
  return;
}

Assistant:

void
MLEBABecLap::FFlux (int amrlev, const MFIter& mfi, const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                    const FArrayBox& sol, Location flux_loc, const int face_only) const
{
    BL_PROFILE("MLEBABecLap::FFlux()");
    const int compute_flux_at_centroid = (Location::FaceCentroid == flux_loc) ? 1 : 0;
    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const int ncomp = getNComp();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    AMREX_D_TERM(const auto& bx = m_b_coeffs[amrlev][mglev][0][mfi];,
                 const auto& by = m_b_coeffs[amrlev][mglev][1][mfi];,
                 const auto& bz = m_b_coeffs[amrlev][mglev][2][mfi];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(box,0);,
                 Box const& ybx = amrex::surroundingNodes(box,1);,
                 Box const& zbx = amrex::surroundingNodes(box,2););
    AMREX_D_TERM(Array4<Real> const& fx = flux[0]->array();,
                 Array4<Real> const& fy = flux[1]->array();,
                 Array4<Real> const& fz = flux[2]->array(););

    const auto fabtyp = (flags) ? (*flags)[mfi].getType(box) : FabType::regular;
    if (fabtyp == FabType::covered) {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(xbx, ncomp, i, j, k, n,
        {
            fx(i,j,k,n) = 0.0;
        });
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(ybx, ncomp, i, j, k, n,
        {
            fy(i,j,k,n) = 0.0;
        });
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(zbx, ncomp, i, j, k, n,
        {
            fz(i,j,k,n) = 0.0;
        });
#endif
    } else if (fabtyp == FabType::regular) {
        MLABecLaplacian::FFlux(box, dxinv, m_b_scalar,
                               Array<FArrayBox const*,AMREX_SPACEDIM>{AMREX_D_DECL(&bx,&by,&bz)},
                               flux, sol, face_only, ncomp);
    } else if (compute_flux_at_centroid) {
        const auto& area = factory->getAreaFrac();
        const auto& fcent = factory->getFaceCent();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                     Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                     Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        Array4<int const> const& msk = ccmask.const_array(mfi);
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
        bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

        if (phi_on_centroid) amrex::Abort("phi_on_centroid is still a WIP");

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x(txbx, fx, apx, fcx, phi, bxcoef, msk, dhx, face_only, ncomp, xbx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y(tybx, fy, apy, fcy, phi, bycoef, msk, dhy, face_only, ncomp, ybx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z(tzbx, fz, apz, fcz, phi, bzcoef, msk, dhz, face_only, ncomp, zbx,
                                   beta_on_centroid, phi_on_centroid);
            }
        );
    } else {
        const auto& area = factory->getAreaFrac();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x_0(txbx, fx, apx, phi, bxcoef, dhx, face_only, ncomp, xbx);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y_0(tybx, fy, apy, phi, bycoef, dhy, face_only, ncomp, ybx);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z_0(tzbx, fz, apz, phi, bzcoef, dhz, face_only, ncomp, zbx);
            }
        );
    }
}